

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall QTreeViewPrivate::lastVisibleItem(QTreeViewPrivate *this,int firstVisual,int offset)

{
  int iVar1;
  int iVar2;
  long lVar3;
  qsizetype qVar4;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  int value;
  int y;
  int local_20;
  int local_1c;
  undefined4 in_stack_fffffffffffffff0;
  QTreeViewPrivate *this_00;
  
  this_00 = *(QTreeViewPrivate **)(in_FS_OFFSET + 0x28);
  if (((in_ESI < 0) || (local_1c = in_ESI, in_EDX < 0)) &&
     (local_1c = firstVisibleItem(this_00,(int *)CONCAT44(in_EDX,in_stack_fffffffffffffff0)),
     local_1c < 0)) {
    local_1c = -1;
  }
  else {
    local_20 = -in_EDX;
    iVar1 = QWidget::height((QWidget *)0x8ff87f);
    for (; lVar3 = (long)local_1c,
        qVar4 = QList<QTreeViewItem>::size((QList<QTreeViewItem> *)(in_RDI + 0x5a0)), lVar3 < qVar4;
        local_1c = local_1c + 1) {
      iVar2 = itemHeight((QTreeViewPrivate *)CONCAT44(iVar1,local_1c),(int)((ulong)in_RDI >> 0x20));
      local_20 = iVar2 + local_20;
      if (iVar1 < local_20) goto LAB_008ff905;
    }
    qVar4 = QList<QTreeViewItem>::size((QList<QTreeViewItem> *)(in_RDI + 0x5a0));
    local_1c = (int)qVar4 + -1;
  }
LAB_008ff905:
  if (*(QTreeViewPrivate **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return local_1c;
}

Assistant:

int QTreeViewPrivate::lastVisibleItem(int firstVisual, int offset) const
{
    if (firstVisual < 0 || offset < 0) {
        firstVisual = firstVisibleItem(&offset);
        if (firstVisual < 0)
            return -1;
    }
    int y = - offset;
    int value = viewport->height();

    for (int i = firstVisual; i < viewItems.size(); ++i) {
        y += itemHeight(i); // the height value is cached
        if (y > value)
            return i;
    }
    return viewItems.size() - 1;
}